

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O1

SourceResultType __thiscall
duckdb::PhysicalWindow::GetData
          (PhysicalWindow *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  StateWithBlockableTasks *this_00;
  WindowGlobalSourceState *this_01;
  WindowLocalSourceState *this_02;
  bool bVar1;
  SourceResultType unaff_BPL;
  unique_lock<std::mutex> guard;
  unique_lock<std::mutex> local_38;
  
  this_01 = (WindowGlobalSourceState *)input->global_state;
  this_02 = (WindowLocalSourceState *)input->local_state;
  WindowGlobalSourceState::CreateTaskList(this_01);
  while( true ) {
    if (((((this_01->stopped)._M_base._M_i & 1U) != 0) ||
        (this_01->total_tasks <= (this_01->finished).super___atomic_base<unsigned_long>._M_i)) ||
       (chunk->count != 0)) goto LAB_00b80b4a;
    bVar1 = WindowLocalSourceState::TaskFinished(this_02);
    if ((bVar1) && (bVar1 = WindowLocalSourceState::TryAssignTask(this_02), !bVar1)) break;
    WindowLocalSourceState::ExecuteTask(this_02,chunk);
  }
  local_38._M_device = &(this_01->super_GlobalSourceState).super_StateWithBlockableTasks.lock;
  local_38._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  if (((this_01->stopped)._M_base._M_i & 1U) == 0) {
    bVar1 = (this_01->started).super___atomic_base<unsigned_long>._M_i < this_01->total_tasks;
  }
  else {
    bVar1 = false;
  }
  this_00 = &(this_01->super_GlobalSourceState).super_StateWithBlockableTasks;
  if (bVar1) {
    unaff_BPL = FINISHED;
    if (((this_00->can_block)._M_base._M_i & 1U) != 0) {
      unaff_BPL = BLOCKED;
      ::std::vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::push_back
                (&(this_01->super_GlobalSourceState).super_StateWithBlockableTasks.blocked_tasks.
                  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>,
                 input->interrupt_state);
    }
  }
  else {
    StateWithBlockableTasks::UnblockTasks(this_00,&local_38);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
  if (bVar1) {
    return unaff_BPL;
  }
LAB_00b80b4a:
  LOCK();
  (this_01->returned).super___atomic_base<unsigned_long>._M_i =
       (this_01->returned).super___atomic_base<unsigned_long>._M_i + chunk->count;
  UNLOCK();
  return chunk->count == 0;
}

Assistant:

SourceResultType PhysicalWindow::GetData(ExecutionContext &context, DataChunk &chunk,
                                         OperatorSourceInput &input) const {
	auto &gsource = input.global_state.Cast<WindowGlobalSourceState>();
	auto &lsource = input.local_state.Cast<WindowLocalSourceState>();

	gsource.CreateTaskList();

	while (gsource.HasUnfinishedTasks() && chunk.size() == 0) {
		if (!lsource.TaskFinished() || lsource.TryAssignTask()) {
			try {
				lsource.ExecuteTask(chunk);
			} catch (...) {
				gsource.stopped = true;
				throw;
			}
		} else {
			auto guard = gsource.Lock();
			if (!gsource.HasMoreTasks()) {
				// no more tasks - exit
				gsource.UnblockTasks(guard);
				break;
			} else {
				// there are more tasks available, but we can't execute them yet
				// block the source
				return gsource.BlockSource(guard, input.interrupt_state);
			}
		}
	}

	gsource.returned += chunk.size();

	if (chunk.size() == 0) {
		return SourceResultType::FINISHED;
	}
	return SourceResultType::HAVE_MORE_OUTPUT;
}